

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

Vec_Wrd_t * Gia_ManDeriveSigns(Gia_Man_t *p,Vec_Int_t *vPivots,int fVerbose)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Vec_Wrd_t *p_00;
  word wVar4;
  word wVar5;
  word *pwVar6;
  bool bVar7;
  word Value;
  int Counter;
  int fChange;
  int i;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  Vec_Wrd_t *vSigns;
  int fVerbose_local;
  Vec_Int_t *vPivots_local;
  Gia_Man_t *p_local;
  
  bVar2 = true;
  Gia_ManFillValue(p);
  Counter = 0;
  while( true ) {
    iVar3 = Vec_IntSize(vPivots);
    bVar7 = false;
    if (Counter < iVar3) {
      iVar3 = Vec_IntEntry(vPivots,Counter);
      pObjRi = Gia_ManObj(p,iVar3);
      bVar7 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pObjRi->Value = Counter;
    Counter = Counter + 1;
  }
  if (fVerbose != 0) {
    printf("Signature propagation: ");
  }
  iVar3 = Gia_ManObjNum(p);
  p_00 = Vec_WrdStart(iVar3);
  do {
    if (!bVar2) {
      if (fVerbose != 0) {
        printf("\n");
      }
      return p_00;
    }
    bVar2 = false;
    Counter = 0;
    while( true ) {
      bVar7 = false;
      if (Counter < p->nObjs) {
        pObjRi = Gia_ManObj(p,Counter);
        bVar7 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      if (pObjRi->Value != 0xffffffff) {
        if (0x3f < pObjRi->Value) {
          __assert_fail("pObj->Value >= 0 && pObj->Value < 64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCone.c"
                        ,0x1bf,"Vec_Wrd_t *Gia_ManDeriveSigns(Gia_Man_t *, Vec_Int_t *, int)");
        }
        uVar1 = pObjRi->Value;
        pwVar6 = Vec_WrdEntryP(p_00,Counter);
        *pwVar6 = 1L << ((byte)uVar1 & 0x3f) | *pwVar6;
      }
      iVar3 = Gia_ObjIsAnd(pObjRi);
      if (iVar3 == 0) {
        iVar3 = Gia_ObjIsCo(pObjRi);
        if (iVar3 != 0) {
          iVar3 = Gia_ObjFaninId0(pObjRi,Counter);
          wVar4 = Vec_WrdEntry(p_00,iVar3);
          pwVar6 = Vec_WrdEntryP(p_00,Counter);
          *pwVar6 = wVar4 | *pwVar6;
        }
      }
      else {
        iVar3 = Gia_ObjFaninId0(pObjRi,Counter);
        wVar4 = Vec_WrdEntry(p_00,iVar3);
        iVar3 = Gia_ObjFaninId1(pObjRi,Counter);
        wVar5 = Vec_WrdEntry(p_00,iVar3);
        pwVar6 = Vec_WrdEntryP(p_00,Counter);
        *pwVar6 = wVar4 | wVar5 | *pwVar6;
      }
      Counter = Counter + 1;
    }
    Value._4_4_ = 0;
    Counter = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(p);
      bVar7 = false;
      if (Counter < iVar3) {
        iVar3 = Gia_ManPoNum(p);
        _fChange = Gia_ManCo(p,iVar3 + Counter);
        bVar7 = false;
        if (_fChange != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar3 + Counter);
          bVar7 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar7) break;
      iVar3 = Gia_ObjId(p,pObjRi);
      wVar4 = Vec_WrdEntry(p_00,iVar3);
      iVar3 = Gia_ObjId(p,_fChange);
      wVar5 = Vec_WrdEntry(p_00,iVar3);
      iVar3 = Gia_ObjId(p,pObjRi);
      pwVar6 = Vec_WrdEntryP(p_00,iVar3);
      *pwVar6 = wVar5 | *pwVar6;
      iVar3 = Gia_ObjId(p,pObjRi);
      wVar5 = Vec_WrdEntry(p_00,iVar3);
      if (wVar4 != wVar5) {
        bVar2 = true;
        Value._4_4_ = Value._4_4_ + 1;
      }
      Counter = Counter + 1;
    }
    if (fVerbose != 0) {
      printf("%d ",(ulong)Value._4_4_);
    }
  } while( true );
}

Assistant:

Vec_Wrd_t * Gia_ManDeriveSigns( Gia_Man_t * p, Vec_Int_t * vPivots, int fVerbose )
{
    Vec_Wrd_t * vSigns;
    Gia_Obj_t * pObj, * pObjRi;
    int i, fChange = 1, Counter;

    Gia_ManFillValue( p );
    Gia_ManForEachObjVec( vPivots, p, pObj, i )
        pObj->Value = i;

    if ( fVerbose )
        printf( "Signature propagation: " );
    vSigns = Vec_WrdStart( Gia_ManObjNum(p) );
    while ( fChange )
    {
        fChange = 0;
        Gia_ManForEachObj( p, pObj, i )
        {
            if ( ~pObj->Value )
            {
                assert( pObj->Value >= 0 && pObj->Value < 64 );
                *Vec_WrdEntryP( vSigns, i ) |= ( (word)1 << pObj->Value );
            }
            if ( Gia_ObjIsAnd(pObj) )
                *Vec_WrdEntryP( vSigns, i ) |= Vec_WrdEntry(vSigns, Gia_ObjFaninId0(pObj, i)) | Vec_WrdEntry(vSigns, Gia_ObjFaninId1(pObj, i));
            else if ( Gia_ObjIsCo(pObj) )
                *Vec_WrdEntryP( vSigns, i ) |= Vec_WrdEntry(vSigns, Gia_ObjFaninId0(pObj, i));
        }
        Counter = 0;
        Gia_ManForEachRiRo( p, pObjRi, pObj, i )
        {
            word Value = Vec_WrdEntry(vSigns, Gia_ObjId(p, pObj));
            *Vec_WrdEntryP( vSigns, Gia_ObjId(p, pObj) ) |= Vec_WrdEntry(vSigns, Gia_ObjId(p, pObjRi));
            if ( Value != Vec_WrdEntry(vSigns, Gia_ObjId(p, pObj)) )
                fChange = 1, Counter++;
        }
        if ( fVerbose )
            printf( "%d ", Counter );
    }
    if ( fVerbose )
       printf( "\n" );
    return vSigns;
}